

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

void __thiscall soplex::SVectorBase<double>::sort(SVectorBase<double> *this)

{
  int iVar1;
  Nonzero<double> *pNVar2;
  double dVar3;
  Nonzero<double> *pNVar4;
  int iVar5;
  SVectorBase<double> *in_RDI;
  Nonzero<double> *e;
  Nonzero<double> *s;
  Nonzero<double> *l;
  Nonzero<double> *w;
  Nonzero<double> dummy;
  Nonzero<double> *local_28;
  Nonzero<double> *local_20;
  Nonzero<double> local_18;
  
  if (in_RDI->m_elem != (Nonzero<double> *)0x0) {
    Nonzero<double>::Nonzero(&local_18);
    pNVar2 = in_RDI->m_elem;
    iVar5 = size(in_RDI);
    local_28 = pNVar2;
    while (local_20 = local_28 + 1, local_20 < pNVar2 + iVar5) {
      if (local_28[1].idx < local_28->idx) {
        dVar3 = local_20->val;
        iVar1 = local_28[1].idx;
        pNVar4 = local_28;
        do {
          local_28 = pNVar4;
          local_28[1].val = local_28->val;
          local_28[1].idx = local_28->idx;
          if (local_28 == pNVar2) break;
          pNVar4 = local_28 + -1;
        } while (iVar1 < local_28[-1].idx);
        local_28->val = dVar3;
        local_28->idx = iVar1;
      }
      local_28 = local_20;
    }
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }